

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O1

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::TryCastTableFilter
          (duckdb *this,TableFilter *global_filter,MultiFileIndexMapping *mapping,
          LogicalType *target_type)

{
  TableFilterType value;
  ExpressionType comparison_type_p;
  pointer puVar1;
  pointer pcVar2;
  Value *pVVar3;
  Value **ppVVar4;
  Value **ppVVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  ConjunctionAndFilter *pCVar9;
  _Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false> _Var10;
  pointer pCVar11;
  ConstantFilter *pCVar12;
  ConstantFilter *this_00;
  ConjunctionOrFilter *pCVar13;
  pointer pCVar14;
  InFilter *pIVar15;
  reference source;
  StructFilter *pSVar16;
  __node_base_ptr p_Var17;
  type mapping_00;
  child_list_t<LogicalType> *this_01;
  const_reference pvVar18;
  OptionalFilter *pOVar19;
  type pTVar20;
  DynamicFilter *pDVar21;
  DynamicFilterData *pDVar22;
  pthread_mutex_t *__mutex;
  type global_filter_00;
  NotImplementedException *this_02;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *it;
  pointer puVar23;
  _Hash_node_base *p_Var24;
  shared_ptr<duckdb::DynamicFilterData,_true> *this_03;
  Value *this_04;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> child_filter;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> new_child_filter;
  templated_unique_single_t res;
  Value local_e8;
  _Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  Value local_98;
  
  value = global_filter->filter_type;
  switch(value) {
  case CONSTANT_COMPARISON:
    pCVar12 = TableFilter::Cast<duckdb::ConstantFilter>(global_filter);
    Value::Value(&local_e8,&pCVar12->constant);
    bVar7 = StatisticsPropagator::CanPropagateCast(&(pCVar12->constant).type_,target_type);
    if ((bVar7) && (bVar7 = Value::DefaultTryCastAs(&local_e8,target_type,false), bVar7)) {
      this_00 = (ConstantFilter *)operator_new(0x50);
      comparison_type_p = (pCVar12->super_TableFilter).field_0x9;
      Value::Value(&local_98,&local_e8);
      ConstantFilter::ConstantFilter(this_00,comparison_type_p,&local_98);
      Value::~Value(&local_98);
    }
    else {
      *(undefined8 *)this = 0;
      this_00 = (ConstantFilter *)0x0;
    }
    *(ConstantFilter **)this = this_00;
    Value::~Value(&local_e8);
    break;
  case IS_NULL:
  case IS_NOT_NULL:
    (*global_filter->_vptr_TableFilter[4])(this);
    break;
  case CONJUNCTION_OR:
    pCVar13 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(global_filter);
    _Var10._M_head_impl = (ConjunctionAndFilter *)operator_new(0x28);
    ConjunctionOrFilter::ConjunctionOrFilter((ConjunctionOrFilter *)_Var10._M_head_impl);
    puVar23 = (pCVar13->super_ConjunctionFilter).child_filters.
              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pCVar13->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_98.type_._0_8_ = _Var10._M_head_impl;
    if (puVar23 != puVar1) {
      do {
        pTVar20 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(puVar23);
        TryCastTableFilter((duckdb *)&local_e8,pTVar20,mapping,target_type);
        uVar6 = local_e8.type_._0_8_;
        if ((Value *)local_e8.type_._0_8_ == (Value *)0x0) {
          *(undefined8 *)this = 0;
        }
        else {
          pCVar14 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                    ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                  *)&local_98);
          ::std::
          vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                      *)&(pCVar14->super_ConjunctionFilter).child_filters,
                     (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      *)&local_e8);
        }
        if ((Value *)local_e8.type_._0_8_ != (Value *)0x0) {
          (*(((ConjunctionFilter *)local_e8.type_._0_8_)->super_TableFilter)._vptr_TableFilter[1])()
          ;
        }
        _Var10._M_head_impl = (ConjunctionAndFilter *)local_98.type_._0_8_;
        if ((Value *)uVar6 == (Value *)0x0) goto LAB_015b8c11;
        puVar23 = puVar23 + 1;
      } while (puVar23 != puVar1);
    }
    goto LAB_015b8840;
  case CONJUNCTION_AND:
    pCVar9 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(global_filter);
    _Var10._M_head_impl = (ConjunctionAndFilter *)operator_new(0x28);
    ConjunctionAndFilter::ConjunctionAndFilter(_Var10._M_head_impl);
    puVar23 = (pCVar9->super_ConjunctionFilter).child_filters.
              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pCVar9->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_98.type_._0_8_ = _Var10._M_head_impl;
    if (puVar23 != puVar1) {
      do {
        pTVar20 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(puVar23);
        TryCastTableFilter((duckdb *)&local_e8,pTVar20,mapping,target_type);
        uVar6 = local_e8.type_._0_8_;
        if ((Value *)local_e8.type_._0_8_ == (Value *)0x0) {
          *(undefined8 *)this = 0;
        }
        else {
          pCVar11 = unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
                    ::operator->((unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
                                  *)&local_98);
          ::std::
          vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                      *)&(pCVar11->super_ConjunctionFilter).child_filters,
                     (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      *)&local_e8);
        }
        if ((Value *)local_e8.type_._0_8_ != (Value *)0x0) {
          (*(((ConjunctionFilter *)local_e8.type_._0_8_)->super_TableFilter)._vptr_TableFilter[1])()
          ;
        }
        _Var10._M_head_impl = (ConjunctionAndFilter *)local_98.type_._0_8_;
        if ((Value *)uVar6 == (Value *)0x0) goto LAB_015b8c11;
        puVar23 = puVar23 + 1;
      } while (puVar23 != puVar1);
    }
LAB_015b8840:
    uVar6 = local_98.type_._0_8_;
    local_98.type_._0_8_ =
         (__uniq_ptr_data<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true,_true>
          )0x0;
    *(undefined8 *)this = uVar6;
    _Var10._M_head_impl = (ConjunctionAndFilter *)local_98.type_._0_8_;
    goto LAB_015b8c11;
  case STRUCT_EXTRACT:
    pSVar16 = TableFilter::Cast<duckdb::StructFilter>(global_filter);
    p_Var24 = (_Hash_node_base *)0x0;
    p_Var17 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_find_before_node
                        (&(mapping->child_mapping)._M_h,
                         pSVar16->child_idx % (mapping->child_mapping)._M_h._M_bucket_count,
                         &pSVar16->child_idx,pSVar16->child_idx);
    if (p_Var17 != (__node_base_ptr)0x0) {
      p_Var24 = p_Var17->_M_nxt;
    }
    if (p_Var24 == (_Hash_node_base *)0x0) goto LAB_015b8ad2;
    mapping_00 = unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                 ::operator*((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                              *)(p_Var24 + 2));
    this_01 = StructType::GetChildTypes_abi_cxx11_(target_type);
    pvVar18 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              ::operator[](this_01,mapping_00->index);
    pTVar20 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              operator*(&pSVar16->child_filter);
    TryCastTableFilter((duckdb *)&local_a8,pTVar20,mapping_00,&pvVar18->second);
    if ((Value *)local_a8._M_head_impl == (Value *)0x0) {
      *(undefined8 *)this = 0;
      _Var10._M_head_impl = (ConjunctionAndFilter *)0x0;
    }
    else {
      pvVar18 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                ::operator[](this_01,mapping_00->index);
      ppVVar4 = (Value **)
                &local_e8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      pcVar2 = (pvVar18->first)._M_dataplus._M_p;
      local_e8.type_._0_8_ = ppVVar4;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar2,pcVar2 + (pvVar18->first)._M_string_length);
      pSVar16 = (StructFilter *)operator_new(0x40);
      ppVVar5 = (Value **)
                &local_98.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      if ((Value **)local_e8.type_._0_8_ == ppVVar4) {
        local_98.is_null = local_e8.is_null;
        local_98._25_7_ = local_e8._25_7_;
        local_98.type_._0_8_ = ppVVar5;
      }
      else {
        local_98.type_.id_ = local_e8.type_.id_;
        local_98.type_.physical_type_ = local_e8.type_.physical_type_;
        local_98.type_._2_6_ = local_e8.type_._2_6_;
      }
      local_98.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_e8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_e8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_e8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_e8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffffffffff00;
      local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_head_impl;
      local_a8._M_head_impl = (ConjunctionAndFilter *)0x0;
      local_e8.type_._0_8_ = ppVVar4;
      StructFilter::StructFilter
                (pSVar16,mapping_00->index,(string *)&local_98,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_a0);
      if ((Value *)local_a0._M_pi != (Value *)0x0) {
        (*(((ConjunctionFilter *)&(local_a0._M_pi)->_vptr__Sp_counted_base)->super_TableFilter).
          _vptr_TableFilter[1])();
      }
      local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((Value **)local_98.type_._0_8_ != ppVVar5) {
        operator_delete((void *)local_98.type_._0_8_);
      }
      *(StructFilter **)this = pSVar16;
      _Var10._M_head_impl = local_a8._M_head_impl;
      if ((Value **)local_e8.type_._0_8_ != ppVVar4) {
        operator_delete((void *)local_e8.type_._0_8_);
        _Var10._M_head_impl = (ConjunctionAndFilter *)local_a8;
      }
    }
    goto LAB_015b8c11;
  case OPTIONAL_FILTER:
    pOVar19 = TableFilter::Cast<duckdb::OptionalFilter>(global_filter);
    pTVar20 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              operator*(&pOVar19->child_filter);
    TryCastTableFilter((duckdb *)&local_e8,pTVar20,mapping,target_type);
    if ((Value *)local_e8.type_._0_8_ == (Value *)0x0) {
      *(undefined8 *)this = 0;
      pOVar19 = (OptionalFilter *)0x0;
    }
    else {
      pOVar19 = (OptionalFilter *)operator_new(0x18);
      local_98.type_.id_ = local_e8.type_.id_;
      local_98.type_.physical_type_ = local_e8.type_.physical_type_;
      local_98.type_._2_6_ = local_e8.type_._2_6_;
      local_e8.type_._0_8_ = (Value *)0x0;
      OptionalFilter::OptionalFilter
                (pOVar19,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_98);
      if ((_Tuple_impl<0UL,_duckdb::ConjunctionAndFilter_*,_std::default_delete<duckdb::ConjunctionAndFilter>_>
           )local_98.type_._0_8_ != (ConjunctionAndFilter *)0x0) {
        (**(code **)(*(long *)local_98.type_._0_8_ + 8))();
      }
    }
    *(OptionalFilter **)this = pOVar19;
    _Var10._M_head_impl = (ConjunctionAndFilter *)local_e8.type_._0_8_;
LAB_015b8c11:
    if ((__uniq_ptr_impl<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>_>
         )_Var10._M_head_impl !=
        (__uniq_ptr_impl<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>_>
         )0x0) {
      (*((_Var10._M_head_impl)->super_ConjunctionFilter).super_TableFilter._vptr_TableFilter[1])();
    }
    break;
  case IN_FILTER:
    pIVar15 = TableFilter::Cast<duckdb::InFilter>(global_filter);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e8,
               &(pIVar15->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    this_04 = (Value *)local_e8.type_._0_8_;
    pVVar3 = (Value *)local_e8.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((element_type *)local_e8.type_._0_8_ ==
        local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
LAB_015b88ab:
      for (; this_04 != pVVar3; this_04 = this_04 + 1) {
        bVar7 = Value::DefaultTryCastAs(this_04,target_type,false);
        if (!bVar7) {
          *(undefined8 *)this = 0;
          goto LAB_015b8b7b;
        }
      }
      pIVar15 = (InFilter *)operator_new(0x28);
      local_98.type_.id_ = local_e8.type_.id_;
      local_98.type_.physical_type_ = local_e8.type_.physical_type_;
      local_98.type_._2_6_ = local_e8.type_._2_6_;
      local_98.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_e8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_98.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_e8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_e8.type_._0_8_ = (Value *)0x0;
      local_e8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_e8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      InFilter::InFilter(pIVar15,(vector<duckdb::Value,_true> *)&local_98);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98);
    }
    else {
      source = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)&local_e8,0);
      bVar7 = StatisticsPropagator::CanPropagateCast(&source->type_,target_type);
      this_04 = (Value *)local_e8.type_._0_8_;
      pVVar3 = (Value *)local_e8.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (bVar7) goto LAB_015b88ab;
      *(undefined8 *)this = 0;
LAB_015b8b7b:
      pIVar15 = (InFilter *)0x0;
    }
    *(InFilter **)this = pIVar15;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e8);
    break;
  case DYNAMIC_FILTER:
    pDVar21 = TableFilter::Cast<duckdb::DynamicFilter>(global_filter);
    if ((pDVar21->filter_data).internal.
        super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_03 = &pDVar21->filter_data;
      pDVar22 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_03);
      if ((pDVar22->initialized != false) &&
         (pDVar22 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_03),
         (pDVar22->filter).
         super_unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ConstantFilter_*,_std::default_delete<duckdb::ConstantFilter>_>
         .super__Head_base<0UL,_duckdb::ConstantFilter_*,_false>._M_head_impl !=
         (ConstantFilter *)0x0)) {
        __mutex = (pthread_mutex_t *)
                  shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_03);
        iVar8 = pthread_mutex_lock(__mutex);
        if (iVar8 == 0) {
          pDVar22 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_03);
          global_filter_00 =
               unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>
               ::operator*(&pDVar22->filter);
          TryCastTableFilter(this,&global_filter_00->super_TableFilter,mapping,target_type);
          pthread_mutex_unlock(__mutex);
          return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)
                 this;
        }
        ::std::__throw_system_error(iVar8);
      }
    }
LAB_015b8ad2:
    *(undefined8 *)this = 0;
    break;
  case EXPRESSION_FILTER:
    *(undefined8 *)this = 0;
    break;
  default:
    this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "Can\'t convert TableFilterType (%s) from global to local indexes","");
    EnumUtil::ToString<duckdb::TableFilterType>((string *)&stack0xffffffffffffffb0,value);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_02,(string *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb0);
    __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

static unique_ptr<TableFilter> TryCastTableFilter(const TableFilter &global_filter, MultiFileIndexMapping &mapping,
                                                  const LogicalType &target_type) {
	auto type = global_filter.filter_type;

	switch (type) {
	case TableFilterType::CONJUNCTION_OR: {
		auto &or_filter = global_filter.Cast<ConjunctionOrFilter>();
		auto res = make_uniq<ConjunctionOrFilter>();
		for (auto &it : or_filter.child_filters) {
			auto child_filter = TryCastTableFilter(*it, mapping, target_type);
			if (!child_filter) {
				return nullptr;
			}
			res->child_filters.push_back(std::move(child_filter));
		}
		return std::move(res);
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &and_filter = global_filter.Cast<ConjunctionAndFilter>();
		auto res = make_uniq<ConjunctionAndFilter>();
		for (auto &it : and_filter.child_filters) {
			auto child_filter = TryCastTableFilter(*it, mapping, target_type);
			if (!child_filter) {
				return nullptr;
			}
			res->child_filters.push_back(std::move(child_filter));
		}
		return std::move(res);
	}
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = global_filter.Cast<StructFilter>();
		auto &child_filter = struct_filter.child_filter;

		// find the corresponding local entry
		auto entry = mapping.child_mapping.find(struct_filter.child_idx);
		if (entry == mapping.child_mapping.end()) {
			// this is constant for this file - abort
			// FIXME: should be handled before
			return nullptr;
		}
		auto &struct_mapping = *entry->second;
		auto &struct_type = StructType::GetChildTypes(target_type);
		auto &child_type = struct_type[struct_mapping.index].second;
		auto new_child_filter = TryCastTableFilter(*child_filter, struct_mapping, child_type);
		if (!new_child_filter) {
			return nullptr;
		}
		auto child_name = struct_type[struct_mapping.index].first;
		return make_uniq<StructFilter>(struct_mapping.index, std::move(child_name), std::move(new_child_filter));
	}
	case TableFilterType::OPTIONAL_FILTER: {
		auto &optional_filter = global_filter.Cast<OptionalFilter>();
		auto child_result = TryCastTableFilter(*optional_filter.child_filter, mapping, target_type);
		if (!child_result) {
			return nullptr;
		}
		return make_uniq<OptionalFilter>(std::move(child_result));
	}
	case TableFilterType::DYNAMIC_FILTER: {
		// we can't transfer dynamic filters over casts directly
		// BUT we can copy the current state of the filter and push that
		// FIXME: we could solve this in a different manner as well by pushing the dynamic filter directly
		auto &dynamic_filter = global_filter.Cast<DynamicFilter>();
		if (!dynamic_filter.filter_data) {
			return nullptr;
		}
		if (!dynamic_filter.filter_data->initialized) {
			return nullptr;
		}
		if (!dynamic_filter.filter_data->filter) {
			return nullptr;
		}
		lock_guard<mutex> lock(dynamic_filter.filter_data->lock);
		return TryCastTableFilter(*dynamic_filter.filter_data->filter, mapping, target_type);
	}
	case TableFilterType::IS_NULL:
	case TableFilterType::IS_NOT_NULL:
		// these filters can just be copied as they don't depend on type
		return global_filter.Copy();
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = global_filter.Cast<ConstantFilter>();
		auto new_constant = constant_filter.constant;
		if (!StatisticsPropagator::CanPropagateCast(constant_filter.constant.type(), target_type)) {
			// type cannot be converted - abort
			return nullptr;
		}
		if (!new_constant.DefaultTryCastAs(target_type)) {
			return nullptr;
		}
		return make_uniq<ConstantFilter>(constant_filter.comparison_type, std::move(new_constant));
	}
	case TableFilterType::IN_FILTER: {
		auto &in_filter = global_filter.Cast<InFilter>();
		auto in_list = in_filter.values;
		if (!in_list.empty() && !StatisticsPropagator::CanPropagateCast(in_list[0].type(), target_type)) {
			// type cannot be converted - abort
			return nullptr;
		}
		for (auto &val : in_list) {
			if (!val.DefaultTryCastAs(target_type)) {
				return nullptr;
			}
		}
		return make_uniq<InFilter>(std::move(in_list));
	}
	case TableFilterType::EXPRESSION_FILTER:
		// unsupported
		return nullptr;
	default:
		throw NotImplementedException("Can't convert TableFilterType (%s) from global to local indexes",
		                              EnumUtil::ToString(type));
	}
}